

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void tcg_op_remove_sparc(TCGContext_conflict7 *s,TCGOp *op)

{
  byte bVar1;
  anon_union_16_2_aaf24f3d_for_link *paVar2;
  long lVar3;
  
  bVar1 = *(byte *)op;
  if (bVar1 < 0x2d) {
    if (bVar1 == 3) {
      lVar3 = 0x18;
    }
    else {
      if (bVar1 != 0x26) goto LAB_009eb7f2;
LAB_009eb7c7:
      lVar3 = 0x30;
    }
  }
  else {
    if (bVar1 != 0x2d) {
      if (bVar1 != 0x67) goto LAB_009eb7f2;
      goto LAB_009eb7c7;
    }
    lVar3 = 0x40;
  }
  lVar3 = *(long *)((long)op->args + lVar3 + -0x18);
  *(short *)(lVar3 + 2) = (short)((uint)*(ushort *)(lVar3 + 2) * 0x10000 + -0x10000 >> 0x10);
LAB_009eb7f2:
  paVar2 = &((op->link).tqe_next)->link;
  if ((op->link).tqe_next == (TCGOp *)0x0) {
    paVar2 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
  }
  (paVar2->tqe_circ).tql_prev = (op->link).tqe_circ.tql_prev;
  ((op->link).tqe_circ.tql_prev)->tql_next = (op->link).tqe_next;
  (op->link).tqe_next = (TCGOp *)0x0;
  (op->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
  (op->link).tqe_circ.tql_prev = (s->free_ops).tqh_circ.tql_prev;
  ((s->free_ops).tqh_circ.tql_prev)->tql_next = op;
  (s->free_ops).tqh_circ.tql_prev = (QTailQLink *)&op->link;
  s->nb_ops = s->nb_ops + -1;
  return;
}

Assistant:

void tcg_op_remove(TCGContext *s, TCGOp *op)
{
    TCGLabel *label;

    switch (op->opc) {
    case INDEX_op_br:
        label = arg_label(op->args[0]);
        label->refs--;
        break;
    case INDEX_op_brcond_i32:
    case INDEX_op_brcond_i64:
        label = arg_label(op->args[3]);
        label->refs--;
        break;
    case INDEX_op_brcond2_i32:
        label = arg_label(op->args[5]);
        label->refs--;
        break;
    default:
        break;
    }

    QTAILQ_REMOVE(&s->ops, op, link);
    QTAILQ_INSERT_TAIL(&s->free_ops, op, link);
    s->nb_ops--;
}